

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::RenderbufferAttachmentErrorsTest::ExpectError
          (RenderbufferAttachmentErrorsTest *this,GLenum expected_error,bool framebuffer,
          bool attachment,bool color_attachment,bool renderbuffertarget,bool renderbuffer)

{
  ostringstream *this_00;
  int iVar1;
  GLenum GVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar4;
  bool *pbVar5;
  char *pcVar6;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  GVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (GVar2 != expected_error) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"NamedFramebufferRenderbuffer called with ");
    pcVar6 = "invalid";
    pcVar4 = "invalid";
    if (framebuffer) {
      pcVar4 = "valid";
    }
    std::operator<<((ostream *)this_00,pcVar4);
    std::operator<<((ostream *)this_00," framebuffer, ");
    pcVar4 = "invalid";
    if (attachment) {
      pcVar4 = "valid";
    }
    std::operator<<((ostream *)this_00,pcVar4);
    pbVar5 = glcts::fixed_sample_locations_values + 1;
    if (color_attachment) {
      pbVar5 = (bool *)0x1786a67;
    }
    std::operator<<((ostream *)this_00,pbVar5);
    std::operator<<((ostream *)this_00," attachment, ");
    pcVar4 = "invalid";
    if (renderbuffertarget) {
      pcVar4 = "valid";
    }
    std::operator<<((ostream *)this_00,pcVar4);
    std::operator<<((ostream *)this_00," renderbuffer target, ");
    if (renderbuffer) {
      pcVar6 = "valid";
    }
    std::operator<<((ostream *)this_00,pcVar6);
    std::operator<<((ostream *)this_00," renderbuffer was expected to generate ");
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = expected_error;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::operator<<((ostream *)this_00,", but ");
    local_1d0.m_getName = glu::getErrorName;
    local_1d0.m_value = GVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this_00);
    std::operator<<((ostream *)this_00," was observed instead.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  do {
    iVar3 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  } while (iVar3 != 0);
  return GVar2 == expected_error;
}

Assistant:

bool RenderbufferAttachmentErrorsTest::ExpectError(glw::GLenum expected_error, bool framebuffer, bool attachment,
												   bool color_attachment, bool renderbuffertarget, bool renderbuffer)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	bool is_ok = true;

	glw::GLenum error = GL_NO_ERROR;

	if (expected_error != (error = gl.getError()))
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "NamedFramebufferRenderbuffer called with "
			<< (framebuffer ? "valid" : "invalid") << " framebuffer, " << (attachment ? "valid" : "invalid")
			<< (color_attachment ? " color" : "") << " attachment, " << (renderbuffertarget ? "valid" : "invalid")
			<< " renderbuffer target, " << (renderbuffer ? "valid" : "invalid")
			<< " renderbuffer was expected to generate " << glu::getErrorStr(expected_error) << ", but "
			<< glu::getErrorStr(error) << " was observed instead." << tcu::TestLog::EndMessage;

		is_ok = false;
	}

	/* Clean additional possible errors. */
	while (gl.getError())
		;

	return is_ok;
}